

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

GCPtr<symbols::Object> __thiscall evaluator::Evaluator::Eval(Evaluator *this,Node *node,Env *env)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  BlockStmt *block;
  ForRangeStmt *for_stmt;
  Env *env_00;
  InitStmt *stmt;
  DeclareStmt *stmt_00;
  FunctionStmt *stmt_01;
  Object *pOVar4;
  FunctionObject *this_00;
  Identifier *ident;
  Object *pOVar5;
  BuiltinFunction *function;
  StringObject *this_01;
  Assign *expr;
  vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *this_02;
  GCPtr<symbols::Object> *this_03;
  undefined1 local_98 [8];
  vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> local_90;
  GCPtr<symbols::Object> local_78;
  GCPtr<symbols::Object> local_70;
  _Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> local_68;
  string local_50;
  
  this_02 = (vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)local_98;
  this_03 = (GCPtr<symbols::Object> *)local_98;
  while( true ) {
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 == 3) {
      block = (BlockStmt *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::BlockStmt::typeinfo,0);
      evalBlockStatement(this,block,env);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 == 0x15) {
      for_stmt = (ForRangeStmt *)
                 __dynamic_cast(node,&ast::Node::typeinfo,&ast::ForRangeStmt::typeinfo,0);
      evalForRangeStatement(this,for_stmt,env);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 == 0xd) {
      env_00 = (Env *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::IfStmt::typeinfo,0);
      evalIfStatement((IfStmt *)this,env_00);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 == 10) {
      lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::ReturnStmt::typeinfo,0);
      Eval((Evaluator *)&local_90,*(Node **)(lVar3 + 0x40),env);
      iVar2 = (**(_func_int **)
                 (local_90.
                  super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->addr)();
      if (iVar2 == 4) {
        GCPtr<symbols::Object>::GCPtr
                  ((GCPtr<symbols::Object> *)this,
                   (Object *)
                   local_90.
                   super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        pOVar5 = (Object *)operator_new(0x18);
        pOVar4 = GCPtr<symbols::Object>::unref((GCPtr<symbols::Object> *)&local_90);
        pOVar5->_type = RETURNTYPE;
        pOVar5->_vptr_Object = (_func_int **)&PTR_type_00122be0;
        pOVar5[1]._vptr_Object = (_func_int **)pOVar4;
        GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar5);
      }
      goto LAB_00108d0b;
    }
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 == 0x11) {
      stmt = (InitStmt *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::InitStmt::typeinfo,0);
      evalInitStatement(this,stmt,env);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 == 0x14) {
      stmt_00 = (DeclareStmt *)
                __dynamic_cast(node,&ast::Node::typeinfo,&ast::DeclareStmt::typeinfo,0);
      evalDeclareStatement(this,stmt_00,env);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 == 0xf) {
      stmt_01 = (FunctionStmt *)
                __dynamic_cast(node,&ast::Node::typeinfo,&ast::FunctionStmt::typeinfo,0);
      evalFunctionStmt(this,stmt_01,env);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 == 0x12) {
      lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::RangeExpr::typeinfo,0);
      pOVar5 = (Object *)operator_new(0x18);
      pOVar5->_type = RANGETYPE;
      pOVar5->_vptr_Object = (_func_int **)&PTR_type_00122cb8;
      uVar1 = *(undefined8 *)(lVar3 + 0x40);
      *(undefined8 *)&pOVar5->field_0xc = uVar1;
      *(int *)((long)&pOVar5[1]._vptr_Object + 4) = (int)uVar1;
      goto LAB_00108c66;
    }
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 != 8) break;
    lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::ExpressionStmt::typeinfo,0);
    node = *(Node **)(lVar3 + 0x40);
  }
  iVar2 = (*node->_vptr_Node[2])(node);
  if (iVar2 == 0x13) {
    lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::CallExpression::typeinfo,0);
    Eval((Evaluator *)local_98,*(Node **)(lVar3 + 0x40),env);
    iVar2 = (***(_func_int ***)local_98)();
    if (iVar2 == 4) {
      GCPtr<symbols::Object>::GCPtr
                ((GCPtr<symbols::Object> *)this,(GCPtr<symbols::Object> *)local_98);
      this_02 = (vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)local_98
      ;
    }
    else {
      evalExpressions(&local_90,(vector<ast::Expr_*,_std::allocator<ast::Expr_*>_> *)(lVar3 + 0x48),
                      env);
      if (((long)local_90.
                 super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_90.
                 super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 8) &&
         (iVar2 = (**(code **)*(_func_int **)
                               (local_90.
                                super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->addr)(), iVar2 == 4)) {
        GCPtr<symbols::Object>::GCPtr
                  ((GCPtr<symbols::Object> *)this,
                   local_90.
                   super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else if ((local_98 == (undefined1  [8])0x0) ||
              (function = (BuiltinFunction *)
                          __dynamic_cast(local_98,&symbols::Object::typeinfo,
                                         &symbols::BuiltinFunction::typeinfo,0),
              function == (BuiltinFunction *)0x0)) {
        applyFunction(this,(GCPtr<symbols::Object> *)local_98,&local_90);
      }
      else {
        GCPtr<symbols::Object>::unref((GCPtr<symbols::Object> *)local_98);
        applyBuiltinFunction(this,function,&local_90);
      }
      std::vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::~vector
                (&local_90);
    }
    goto LAB_00108ede;
  }
  iVar2 = (*node->_vptr_Node[2])(node);
  if (iVar2 == 0x10) {
    lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::FunctionLiteral::typeinfo,0);
    this_00 = (FunctionObject *)operator_new(0x38);
    std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::vector
              ((vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> *)&local_68,
               (vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> *)(lVar3 + 0x48));
    symbols::FunctionObject::FunctionObject
              (this_00,(vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> *)&local_68,
               *(BlockStmt **)(lVar3 + 0x60),env);
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_00);
    std::_Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::~_Vector_base
              (&local_68);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])(node);
  if (iVar2 == 0xc) {
    ident = (Identifier *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::Identifier::typeinfo,0);
    pOVar5 = evalIdentifier(ident,env);
LAB_00108c66:
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar5);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])(node);
  if (iVar2 == 0xb) {
    lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::StringLiteral::typeinfo,0);
    this_01 = (StringObject *)operator_new(0x38);
    std::__cxx11::string::string
              ((string *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar3 + 0x40));
    symbols::StringObject::StringObject(this_01,&local_50);
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_01);
    std::__cxx11::string::~string((string *)&local_50);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])(node);
  if (iVar2 == 5) {
    lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::Number::typeinfo,0);
    pOVar5 = (Object *)operator_new(0x18);
    iVar2 = *(int *)(lVar3 + 0x40);
    pOVar5->_type = INTTYPE;
    pOVar5->_vptr_Object = (_func_int **)&PTR_type_00122b08;
    pOVar5[1]._vptr_Object = (_func_int **)(long)iVar2;
    goto LAB_00108c66;
  }
  iVar2 = (*node->_vptr_Node[2])(node);
  if (iVar2 == 4) {
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_NULL);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])(node);
  if (iVar2 == 1) {
    lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::BooleanExpr::typeinfo,0);
    nativeBooleanObject(this,*(bool *)(lVar3 + 0x40));
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])(node);
  if (iVar2 == 0x16) {
    expr = (Assign *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::Assign::typeinfo,0);
    evalAssignExpression(this,expr,env);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])(node);
  if (iVar2 == 7) {
    lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::UniaryOp::typeinfo,0);
    Eval((Evaluator *)&local_90,*(Node **)(lVar3 + 0x48),env);
    iVar2 = (**(_func_int **)
               (local_90.
                super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->addr)();
    if (iVar2 == 4) {
      GCPtr<symbols::Object>::GCPtr
                ((GCPtr<symbols::Object> *)this,(GCPtr<symbols::Object> *)&local_90);
      goto LAB_00108d0b;
    }
    GCPtr<symbols::Object>::GCPtr(&local_70,(GCPtr<symbols::Object> *)&local_90);
    evalUniaryExpression(this,(Token *)(lVar3 + 0x10),&local_70);
    this_03 = &local_70;
  }
  else {
    iVar2 = (*node->_vptr_Node[2])(node);
    if (iVar2 != 6) {
      pOVar5 = (Object *)0x0;
      goto LAB_00108c66;
    }
    lVar3 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::BinaryOp::typeinfo,0);
    Eval((Evaluator *)&local_90,*(Node **)(lVar3 + 0x50),env);
    iVar2 = (**(_func_int **)
               (local_90.
                super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->addr)();
    if (iVar2 == 4) {
      pOVar5 = GCPtr<symbols::Object>::unref((GCPtr<symbols::Object> *)&local_90);
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar5);
      goto LAB_00108d0b;
    }
    Eval((Evaluator *)local_98,*(Node **)(lVar3 + 0x48),env);
    iVar2 = (***(_func_int ***)local_98)();
    if (iVar2 == 4) {
      pOVar5 = GCPtr<symbols::Object>::unref((GCPtr<symbols::Object> *)local_98);
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar5);
      this_03 = (GCPtr<symbols::Object> *)local_98;
    }
    else {
      evalBinaryExpression
                ((Evaluator *)&local_78,(Token *)(lVar3 + 0x10),(GCPtr<symbols::Object> *)&local_90,
                 (GCPtr<symbols::Object> *)local_98);
      GCPtr<symbols::Object>::unref((GCPtr<symbols::Object> *)&local_90);
      GCPtr<symbols::Object>::unref((GCPtr<symbols::Object> *)local_98);
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,local_78.addr);
      GCPtr<symbols::Object>::~GCPtr(&local_78);
    }
  }
  GCPtr<symbols::Object>::~GCPtr(this_03);
LAB_00108d0b:
  this_02 = &local_90;
LAB_00108ede:
  GCPtr<symbols::Object>::~GCPtr((GCPtr<symbols::Object> *)this_02);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::Eval(Node* node, Env* env)
{
    if (node->type() == NodeType::BlockStmtType){
        auto block = dynamic_cast<BlockStmt*>(node);
        return evalBlockStatement(block, env);
    }
    else if (node->type() == NodeType::ForStmtType){
        auto* for_stmt = dynamic_cast<ForRangeStmt*>(node);
        return evalForRangeStatement(for_stmt, env);
    }
   else if(node->type() == NodeType::IfStmtType){
       auto stmt = dynamic_cast<IfStmt*>(node);
       return evalIfStatement(stmt, env);
   }
   else if(node->type() == NodeType::ReturnStmtType){
       auto stmt = dynamic_cast<ReturnStmt*>(node);
       auto value = Eval(stmt->returnValue, env);
       if(isError(value)){
           return value.raw();
       }
       return new ReturnObject(value.unref());
   }
   else if(node->type() == NodeType::InitStmtType){
       auto stmt = dynamic_cast<InitStmt*>(node);
       return evalInitStatement(stmt, env);
   }
   else if(node->type() == NodeType::DeclareStmtType){
       auto stmt = dynamic_cast<DeclareStmt*>(node);
       return evalDeclareStatement(stmt, env);
   }
   else if(node->type() == NodeType::FunctionStmtType){
       auto stmt = dynamic_cast<FunctionStmt*>(node);
       return evalFunctionStmt(stmt, env);
   }
   else if(node->type() == NodeType::RangeExprType){
        auto* expr = dynamic_cast<RangeExpr*>(node);
        return new RangeObject(expr->init_value, expr->end_value);
   }
   else if(node->type() == NodeType::ExpressionStmtType){
       auto stmt = dynamic_cast<ExpressionStmt*>(node);
       return Eval(stmt->Expression, env);
   }
   else if(node->type() == NodeType::CallExprType){
       auto expr = dynamic_cast<CallExpression*>(node);
       auto function = Eval(expr->function, env);
       if(isError(function)){
           return function;
       }
       auto args = evalExpressions(expr->arguments, env);
       if(args.size() == 1 && isError(args[0])){
            return args[0];
       }
       if(auto builtin_func = dynamic_cast<BuiltinFunction*>(function.raw())){
            function.unref();
            return applyBuiltinFunction(builtin_func, args);
       }
       return applyFunction(function, args);
   }
   else if(node->type() == NodeType::FunctionExprType){
       auto func = dynamic_cast<FunctionLiteral*>(node);
       return new FunctionObject(func->parameters, func->body, env);
   }
   else if(node->type() == NodeType::IdentifierType){
       auto ident = dynamic_cast<Identifier*>(node);
       return evalIdentifier(ident, env);
   }
   else if(node->type() == NodeType::StringLiteralType){
       auto literal = dynamic_cast<StringLiteral*>(node);
       return new StringObject(literal->Literal);
   }
   else if(node->type() == NodeType::NumberType){
       auto num = dynamic_cast<Number*>(node);
       return new IntObject(num->value);
   }
   else if(node->type() == NodeType::NullType){
       return NATIVE_NULL;
   }
   else if(node->type() == NodeType::BooleanType){
       auto expr = dynamic_cast<BooleanExpr*>(node);
       return nativeBooleanObject(expr->value);
   }
   else if(node->type() == NodeType::AssignStmtType){
        auto* expr = dynamic_cast<Assign*>(node);
        return evalAssignExpression(expr, env);
   }
   else if(node->type() == NodeType::UniaryOpType){
       auto Op = dynamic_cast<UniaryOp*>(node);
       auto RightValue = Eval(Op->RightOp, env);
       if(isError(RightValue)){
           return RightValue;
       }
       return evalUniaryExpression(Op->tok, RightValue);
   }else if(node->type() == NodeType::BinaryOpType){
       auto Op = dynamic_cast<BinaryOp*>(node);
       auto LeftValue = Eval(Op->LeftOp, env);
       if(isError(LeftValue)){
           return LeftValue.unref();
       }
       auto RightValue = Eval(Op->RightOp, env);
       if(isError(RightValue)){
           return RightValue.unref();
       }
       auto value = evalBinaryExpression(Op->tok, LeftValue, RightValue);
       LeftValue.unref();
       RightValue.unref();
       return value.raw();
   }
   return nullptr;
}